

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O2

void __thiscall
Iir::ChebyshevI::AnalogLowPass::design(AnalogLowPass *this,int numPoles,double rippleDb)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  complex_t local_68;
  double local_58;
  double dStack_50;
  undefined1 local_48 [16];
  
  if (this->m_numPoles == numPoles) {
    if ((this->m_rippleDb == rippleDb) && (!NAN(this->m_rippleDb) && !NAN(rippleDb))) {
      return;
    }
  }
  this->m_numPoles = numPoles;
  this->m_rippleDb = rippleDb;
  (this->super_LayoutBase).m_numPoles = 0;
  dVar1 = exp(rippleDb * -0.1 * 2.302585092994046);
  dVar1 = 1.0 / dVar1 + -1.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar1 = asinh<double>(1.0 / dVar1);
  dVar2 = sinh(dVar1 / (double)numPoles);
  dVar1 = cosh(dVar1 / (double)numPoles);
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_8_ = dVar1;
  local_48._12_4_ = extraout_XMM0_Dd;
  uVar5 = 0;
  if (0 < (int)((long)numPoles / 2)) {
    uVar5 = (long)numPoles / 2 & 0xffffffff;
  }
  iVar6 = 1 - numPoles;
  while (iVar4 = (int)uVar5, uVar5 = (ulong)(iVar4 - 1), iVar4 != 0) {
    dVar1 = ((double)iVar6 * 3.141592653589793) / (double)(numPoles * 2);
    dVar3 = cos(dVar1);
    dStack_50 = sin(dVar1);
    local_58 = -dVar2 * dVar3;
    dStack_50 = dStack_50 * (double)local_48._0_8_;
    local_68._M_value._0_8_ = 0x7ff0000000000000;
    local_68._M_value._8_8_ = 0;
    LayoutBase::addPoleZeroConjugatePairs(&this->super_LayoutBase,(complex_t *)&local_58,&local_68);
    iVar6 = iVar6 + 2;
  }
  if ((numPoles & 1U) == 0) {
    dVar1 = pow(10.0,rippleDb / -20.0);
    uVar7 = SUB84(dVar1,0);
    uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
    dStack_50 = 0.0;
    local_68._M_value._0_8_ = 0x7ff0000000000000;
    local_68._M_value._8_8_ = 0;
    local_58 = -dVar2;
    LayoutBase::add(&this->super_LayoutBase,(complex_t *)&local_58,&local_68);
    uVar7 = 0;
    uVar8 = 0x3ff00000;
  }
  (this->super_LayoutBase).m_normalW = 0.0;
  (this->super_LayoutBase).m_normalGain = (double)CONCAT44(uVar8,uVar7);
  return;
}

Assistant:

void AnalogLowPass::design (int numPoles,
                            double rippleDb)
{
  if (m_numPoles != numPoles ||
      m_rippleDb != rippleDb)
  {
    m_numPoles = numPoles;
    m_rippleDb = rippleDb;

    reset ();

    const double eps = std::sqrt (1. / std::exp (-rippleDb * 0.1 * doubleLn10) - 1);
    const double v0 = asinh (1 / eps) / numPoles;
    const double sinh_v0 = -sinh (v0);
    const double cosh_v0 = cosh (v0);

    const double n2 = 2 * numPoles;
    const int pairs = numPoles / 2;
    for (int i = 0; i < pairs; ++i)
    {
      const int k = 2 * i + 1 - numPoles;
      double a = sinh_v0 * cos (k * doublePi / n2);
      double b = cosh_v0 * sin (k * doublePi / n2);

      addPoleZeroConjugatePairs (complex_t (a, b), infinity());
    }

    if (numPoles & 1)
    {
      add (complex_t (sinh_v0, 0), infinity());
      setNormal (0, 1);
    }
    else
    {
      setNormal (0, pow (10, -rippleDb/20.));
    }
  }
}